

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O3

void sg_destroy_buffer(sg_buffer buf_id)

{
  _Bool _Var1;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                  ,0x3b38,"void sg_destroy_buffer(sg_buffer)");
  }
  _Var1 = _sg_uninit_buffer(buf_id);
  if (_Var1) {
    _sg_dealloc_buffer(buf_id);
    return;
  }
  return;
}

Assistant:

_SOKOL_PRIVATE void _sg_gl_destroy_buffer(_sg_buffer_t* buf) {
    SOKOL_ASSERT(buf);
    _SG_GL_CHECK_ERROR();
    for (int slot = 0; slot < buf->cmn.num_slots; slot++) {
        if (buf->gl.buf[slot]) {
            _sg_gl_cache_invalidate_buffer(buf->gl.buf[slot]);
            if (!buf->gl.ext_buffers) {
                glDeleteBuffers(1, &buf->gl.buf[slot]);
            }
        }
    }
    _SG_GL_CHECK_ERROR();
}